

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O1

void extract_bookmarks(vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                       *outlines,vector<int,_std::allocator<int>_> *numbers)

{
  int *piVar1;
  pointer *ppiVar2;
  iterator __position;
  ulong i;
  long lVar3;
  int local_a4;
  long local_a0;
  vector<int,_std::allocator<int>_> local_98;
  undefined **local_80 [2];
  long local_70;
  undefined8 local_68;
  long local_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_48 [24];
  
  local_a4 = 0;
  if (style == st_lines) {
    i = (*(long *)(outlines + 8) - *(long *)outlines >> 3) * 0x6db6db6db6db6db7;
    if ((i & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
    }
    local_a4 = -(int)i;
  }
  __position._M_current =
       (numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(numbers,__position,&local_a4);
  }
  else {
    *__position._M_current = local_a4;
    (numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  lVar3 = *(long *)outlines;
  local_a0 = *(long *)(outlines + 8);
  if (lVar3 != local_a0) {
    do {
      piVar1 = (numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1;
      *piVar1 = *piVar1 + 1;
      local_80[1] = *(undefined ***)(lVar3 + 8);
      local_70 = *(long *)(lVar3 + 0x10);
      if (local_70 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_70 + 8) = *(int *)(local_70 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_70 + 8) = *(int *)(local_70 + 8) + 1;
        }
      }
      local_68 = *(undefined8 *)(lVar3 + 0x18);
      local_60 = *(long *)(lVar3 + 0x20);
      if (local_60 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_60 + 8) = *(int *)(local_60 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_60 + 8) = *(int *)(local_60 + 8) + 1;
        }
      }
      local_80[0] = &PTR__QPDFOutlineObjectHelper_00106d08;
      local_58 = *(element_type **)(lVar3 + 0x28);
      local_50._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x30);
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_50._M_pi + 8) = *(int *)(local_50._M_pi + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_50._M_pi + 8) = *(int *)(local_50._M_pi + 8) + 1;
        }
      }
      std::vector<int,_std::allocator<int>_>::vector(&local_98,numbers);
      show_bookmark_details((QPDFOutlineObjectHelper *)local_80,&local_98);
      if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper((QPDFOutlineObjectHelper *)local_80);
      QPDFOutlineObjectHelper::getKids();
      extract_bookmarks(local_48,numbers);
      std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
                (local_48);
      lVar3 = lVar3 + 0x38;
    } while (lVar3 != local_a0);
  }
  ppiVar2 = &(numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppiVar2 = *ppiVar2 + -1;
  return;
}

Assistant:

void
extract_bookmarks(std::vector<QPDFOutlineObjectHelper> outlines, std::vector<int>& numbers)
{
    // For style == st_numbers, numbers.at(n) contains the numerical label for the outline, so we
    // count up from 1.
    // For style == st_lines, numbers.at(n) == 0 indicates the last outline at level n, and we don't
    // otherwise care what the value is, so we count up to zero.
    numbers.push_back((style == st_lines) ? -QIntC::to_int(outlines.size()) : 0);
    for (auto& outline: outlines) {
        ++(numbers.back());
        show_bookmark_details(outline, numbers);
        extract_bookmarks(outline.getKids(), numbers);
    }
    numbers.pop_back();
}